

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZipkinCollector.cpp
# Opt level: O0

void __thiscall
twitter::zipkin::thrift::ZipkinCollectorConcurrentClient::recv_submitZipkinBatch
          (ZipkinCollectorConcurrentClient *this,
          vector<twitter::zipkin::thrift::Response,_std::allocator<twitter::zipkin::thrift::Response>_>
          *_return,int32_t seqid)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  TApplicationException *pTVar4;
  TProtocolException *this_00;
  int32_t *rseqid_00;
  void *__buf;
  void *__buf_00;
  allocator local_111;
  string local_110;
  undefined1 local_f0 [24];
  ZipkinCollector_submitZipkinBatch_presult result;
  undefined1 local_b8 [16];
  undefined1 local_a8 [24];
  TApplicationException x;
  undefined1 local_58 [8];
  TConcurrentRecvSentry sentry;
  undefined1 local_40 [4];
  TMessageType mtype;
  string fname;
  int32_t rseqid;
  int32_t seqid_local;
  vector<twitter::zipkin::thrift::Response,_std::allocator<twitter::zipkin::thrift::Response>_>
  *_return_local;
  ZipkinCollectorConcurrentClient *this_local;
  
  fname.field_2._8_4_ = 0;
  fname.field_2._12_4_ = seqid;
  std::__cxx11::string::string((string *)local_40);
  apache::thrift::async::TConcurrentRecvSentry::TConcurrentRecvSentry
            ((TConcurrentRecvSentry *)local_58,&this->sync_,fname.field_2._12_4_);
  while( true ) {
    rseqid_00 = (int32_t *)(fname.field_2._M_local_buf + 8);
    bVar1 = apache::thrift::async::TConcurrentClientSyncInfo::getPending
                      (&this->sync_,(string *)local_40,(TMessageType *)&sentry.committed_,rseqid_00)
    ;
    if (!bVar1) {
      rseqid_00 = (int32_t *)(fname.field_2._M_local_buf + 8);
      apache::thrift::protocol::TProtocol::readMessageBegin
                (this->iprot_,(string *)local_40,(TMessageType *)&sentry.committed_,rseqid_00);
    }
    if (fname.field_2._12_4_ == fname.field_2._8_4_) break;
    apache::thrift::async::TConcurrentClientSyncInfo::updatePending
              (&this->sync_,(string *)local_40,sentry._12_4_,fname.field_2._8_4_);
    apache::thrift::async::TConcurrentClientSyncInfo::waitForWork(&this->sync_,fname.field_2._12_4_)
    ;
  }
  if (sentry._12_4_ == 3) {
    apache::thrift::TApplicationException::TApplicationException
              ((TApplicationException *)(local_a8 + 0x10));
    apache::thrift::TApplicationException::read
              ((TApplicationException *)(local_a8 + 0x10),(int)this->iprot_,__buf,(size_t)rseqid_00)
    ;
    apache::thrift::protocol::TProtocol::readMessageEnd(this->iprot_);
    apache::thrift::protocol::TProtocol::getTransport((TProtocol *)local_a8);
    peVar3 = std::
             __shared_ptr_access<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_a8);
    (*peVar3->_vptr_TTransport[8])();
    std::shared_ptr<apache::thrift::transport::TTransport>::~shared_ptr
              ((shared_ptr<apache::thrift::transport::TTransport> *)local_a8);
    apache::thrift::async::TConcurrentRecvSentry::commit((TConcurrentRecvSentry *)local_58);
    pTVar4 = (TApplicationException *)__cxa_allocate_exception(0x30);
    apache::thrift::TApplicationException::TApplicationException
              (pTVar4,(TApplicationException *)(local_a8 + 0x10));
    __cxa_throw(pTVar4,&apache::thrift::TApplicationException::typeinfo,
                apache::thrift::TApplicationException::~TApplicationException);
  }
  if (sentry._12_4_ != 2) {
    apache::thrift::protocol::TProtocol::skip(this->iprot_,T_STRUCT);
    apache::thrift::protocol::TProtocol::readMessageEnd(this->iprot_);
    apache::thrift::protocol::TProtocol::getTransport((TProtocol *)local_b8);
    peVar3 = std::
             __shared_ptr_access<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_b8);
    (*peVar3->_vptr_TTransport[8])();
    std::shared_ptr<apache::thrift::transport::TTransport>::~shared_ptr
              ((shared_ptr<apache::thrift::transport::TTransport> *)local_b8);
  }
  iVar2 = std::__cxx11::string::compare(local_40);
  if (iVar2 != 0) {
    apache::thrift::protocol::TProtocol::skip(this->iprot_,T_STRUCT);
    apache::thrift::protocol::TProtocol::readMessageEnd(this->iprot_);
    apache::thrift::protocol::TProtocol::getTransport((TProtocol *)&result.__isset);
    peVar3 = std::
             __shared_ptr_access<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&result.__isset);
    (*peVar3->_vptr_TTransport[8])();
    std::shared_ptr<apache::thrift::transport::TTransport>::~shared_ptr
              ((shared_ptr<apache::thrift::transport::TTransport> *)&result.__isset);
    this_00 = (TProtocolException *)__cxa_allocate_exception(0x30);
    apache::thrift::protocol::TProtocolException::TProtocolException(this_00,INVALID_DATA);
    __cxa_throw(this_00,&apache::thrift::protocol::TProtocolException::typeinfo,
                apache::thrift::protocol::TProtocolException::~TProtocolException);
  }
  ZipkinCollector_submitZipkinBatch_presult::ZipkinCollector_submitZipkinBatch_presult
            ((ZipkinCollector_submitZipkinBatch_presult *)(local_f0 + 0x10));
  result._vptr_ZipkinCollector_submitZipkinBatch_presult = (_func_int **)_return;
  ZipkinCollector_submitZipkinBatch_presult::read
            ((ZipkinCollector_submitZipkinBatch_presult *)(local_f0 + 0x10),(int)this->iprot_,
             __buf_00,(size_t)_return);
  apache::thrift::protocol::TProtocol::readMessageEnd(this->iprot_);
  apache::thrift::protocol::TProtocol::getTransport((TProtocol *)local_f0);
  peVar3 = std::
           __shared_ptr_access<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_f0);
  (*peVar3->_vptr_TTransport[8])();
  std::shared_ptr<apache::thrift::transport::TTransport>::~shared_ptr
            ((shared_ptr<apache::thrift::transport::TTransport> *)local_f0);
  if (((byte)result.success & 1) != 0) {
    apache::thrift::async::TConcurrentRecvSentry::commit((TConcurrentRecvSentry *)local_58);
    ZipkinCollector_submitZipkinBatch_presult::~ZipkinCollector_submitZipkinBatch_presult
              ((ZipkinCollector_submitZipkinBatch_presult *)(local_f0 + 0x10));
    apache::thrift::async::TConcurrentRecvSentry::~TConcurrentRecvSentry
              ((TConcurrentRecvSentry *)local_58);
    std::__cxx11::string::~string((string *)local_40);
    return;
  }
  pTVar4 = (TApplicationException *)__cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_110,"submitZipkinBatch failed: unknown result",&local_111);
  apache::thrift::TApplicationException::TApplicationException(pTVar4,MISSING_RESULT,&local_110);
  __cxa_throw(pTVar4,&apache::thrift::TApplicationException::typeinfo,
              apache::thrift::TApplicationException::~TApplicationException);
}

Assistant:

void ZipkinCollectorConcurrentClient::recv_submitZipkinBatch(std::vector<Response> & _return, const int32_t seqid)
{

  int32_t rseqid = 0;
  std::string fname;
  ::apache::thrift::protocol::TMessageType mtype;

  // the read mutex gets dropped and reacquired as part of waitForWork()
  // The destructor of this sentry wakes up other clients
  ::apache::thrift::async::TConcurrentRecvSentry sentry(&this->sync_, seqid);

  while(true) {
    if(!this->sync_.getPending(fname, mtype, rseqid)) {
      iprot_->readMessageBegin(fname, mtype, rseqid);
    }
    if(seqid == rseqid) {
      if (mtype == ::apache::thrift::protocol::T_EXCEPTION) {
        ::apache::thrift::TApplicationException x;
        x.read(iprot_);
        iprot_->readMessageEnd();
        iprot_->getTransport()->readEnd();
        sentry.commit();
        throw x;
      }
      if (mtype != ::apache::thrift::protocol::T_REPLY) {
        iprot_->skip(::apache::thrift::protocol::T_STRUCT);
        iprot_->readMessageEnd();
        iprot_->getTransport()->readEnd();
      }
      if (fname.compare("submitZipkinBatch") != 0) {
        iprot_->skip(::apache::thrift::protocol::T_STRUCT);
        iprot_->readMessageEnd();
        iprot_->getTransport()->readEnd();

        // in a bad state, don't commit
        using ::apache::thrift::protocol::TProtocolException;
        throw TProtocolException(TProtocolException::INVALID_DATA);
      }
      ZipkinCollector_submitZipkinBatch_presult result;
      result.success = &_return;
      result.read(iprot_);
      iprot_->readMessageEnd();
      iprot_->getTransport()->readEnd();

      if (result.__isset.success) {
        // _return pointer has now been filled
        sentry.commit();
        return;
      }
      // in a bad state, don't commit
      throw ::apache::thrift::TApplicationException(::apache::thrift::TApplicationException::MISSING_RESULT, "submitZipkinBatch failed: unknown result");
    }
    // seqid != rseqid
    this->sync_.updatePending(fname, mtype, rseqid);

    // this will temporarily unlock the readMutex, and let other clients get work done
    this->sync_.waitForWork(seqid);
  } // end while(true)
}